

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# darknetshortcut.cpp
# Opt level: O2

int __thiscall
ncnn::DarknetShortcut::forward
          (DarknetShortcut *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  undefined4 uVar1;
  undefined4 uVar2;
  Mat *this_00;
  Mat *this_01;
  uint uVar3;
  void *pvVar4;
  void *pvVar5;
  int iVar6;
  int iVar7;
  long lVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  long lVar12;
  uint uVar13;
  uint uVar14;
  int iVar15;
  long lVar16;
  int iVar17;
  float *pfVar18;
  bool bVar19;
  int local_ac;
  Mat local_70;
  
  this_00 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
            super__Vector_impl_data._M_start;
  iVar11 = this_00->w;
  iVar9 = this_00->h;
  iVar7 = this_00[1].w;
  iVar15 = this_00[1].h;
  uVar14 = iVar11 / iVar7;
  iVar17 = -1;
  if ((uVar14 == iVar9 / iVar15) &&
     (uVar13 = (uint)((long)iVar7 / (long)iVar11), uVar13 == iVar15 / iVar9)) {
    if ((int)uVar14 < 2) {
      uVar14 = 1;
    }
    uVar3 = 1;
    if (1 < (int)uVar13) {
      uVar3 = uVar13;
    }
    iVar10 = iVar7;
    if (iVar11 < iVar7) {
      iVar10 = iVar11;
    }
    if (iVar9 < iVar15) {
      iVar15 = iVar9;
    }
    iVar9 = this_00[1].c;
    if (this_00->c < this_00[1].c) {
      iVar9 = this_00->c;
    }
    this_01 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
              super__Vector_impl_data._M_start;
    Mat::clone(&local_70,(__fn *)(this_00 + 1),(void *)0x0,(int)top_blobs,
               (void *)((long)iVar7 / (long)iVar11 & 0xffffffff));
    Mat::operator=(this_01,&local_70);
    Mat::~Mat(&local_70);
    iVar17 = -100;
    if ((this_01->data != (void *)0x0) && ((long)this_01->c * this_01->cstep != 0)) {
      if (iVar10 < 1) {
        iVar10 = 0;
      }
      if (iVar15 < 1) {
        iVar15 = 0;
      }
      if (iVar9 < 1) {
        iVar9 = 0;
      }
      for (iVar11 = 0; iVar11 != iVar9; iVar11 = iVar11 + 1) {
        local_ac = 0;
        iVar17 = 0;
        for (iVar7 = 0; iVar7 != iVar15; iVar7 = iVar7 + 1) {
          Mat::channel(&local_70,this_00,iVar11);
          pfVar18 = (float *)((long)(local_70.w * iVar17) * local_70.elemsize + (long)local_70.data)
          ;
          Mat::~Mat(&local_70);
          Mat::channel(&local_70,this_00 + 1,iVar11);
          pvVar4 = local_70.data;
          lVar16 = (long)(local_70.w * local_ac) * local_70.elemsize;
          Mat::~Mat(&local_70);
          Mat::channel(&local_70,this_01,iVar11);
          pvVar5 = local_70.data;
          lVar12 = (long)(local_70.w * local_ac) * local_70.elemsize;
          Mat::~Mat(&local_70);
          local_ac = local_ac + uVar3;
          lVar8 = 0;
          iVar6 = iVar10;
          while (bVar19 = iVar6 != 0, iVar6 = iVar6 + -1, bVar19) {
            uVar1 = this->alpha;
            uVar2 = this->beta;
            *(float *)((long)pvVar5 + lVar8 + lVar12) =
                 *pfVar18 * (float)uVar2 + *(float *)((long)pvVar4 + lVar8 + lVar16) * (float)uVar1;
            pfVar18 = pfVar18 + uVar14;
            lVar8 = lVar8 + (ulong)uVar3 * 4;
          }
          iVar17 = iVar17 + uVar14;
        }
      }
      iVar17 = 0;
    }
  }
  return iVar17;
}

Assistant:

int DarknetShortcut::forward(const std::vector<Mat> &bottom_blobs,
                             std::vector<Mat> &top_blobs,
                             const Option &opt) const
{
  const Mat &bottom_blob = bottom_blobs[0];
  int w = bottom_blob.w;
  int h = bottom_blob.h;
  int c = bottom_blob.c;

  const Mat &bottom_blob1 = bottom_blobs[1];
  int o_w = bottom_blob1.w;
  int o_h = bottom_blob1.h;
  int o_c = bottom_blob1.c;

  int i_stride = w / o_w;
  int o_stride = o_w / w;
  if (i_stride != h / o_h) return -1;
  if (o_stride != o_h / h) return -1;
  i_stride = i_stride < 1 ? 1 : i_stride;
  o_stride = o_stride < 1 ? 1 : o_stride;

  int op_w = w < o_w ? w : o_w;
  int op_h = h < o_h ? h : o_h;
  int op_c = c < o_c ? c : o_c;

  Mat &top_blob = top_blobs[0];
  size_t elemsize = bottom_blob.elemsize;
  top_blob = bottom_blob1.clone();
  if (top_blob.empty())
    return -100;

  #pragma omp parallel for num_threads(opt.num_threads)
  for (int q = 0; q < op_c; q++)
  {

    int out_offset_h = 0;
    int in_offset_h = 0;

    for (int hi = 0; hi < op_h; hi++)
    {

      const float *ptr1 = bottom_blob.channel(q).row(in_offset_h);
      const float *ptr2 = bottom_blob1.channel(q).row(out_offset_h);
      float *outptr = top_blob.channel(q).row(out_offset_h);

      out_offset_h += o_stride;
      in_offset_h += i_stride;

      for (int i = 0; i < op_w; i++)
      {
        *outptr = alpha * (*ptr2) + beta * (*ptr1);

        ptr2 += o_stride;
        ptr1 += i_stride;
        outptr += o_stride;
      }
    }
  }

  return 0;
}